

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O2

void __thiscall VCToolBase::parseOptions(VCToolBase *this,ProStringList *options)

{
  ProString *pPVar1;
  char *pcVar2;
  const_iterator copy;
  ProString *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar1 = (options->super_QList<ProString>).d.ptr;
  for (this_00 = pPVar1; this_00 != pPVar1 + (options->super_QList<ProString>).d.size;
      this_00 = this_00 + 1) {
    ProString::toLatin1((QByteArray *)&QStack_48,this_00);
    pcVar2 = QStack_48.ptr;
    if (QStack_48.ptr == (char *)0x0) {
      pcVar2 = (char *)&QByteArray::_empty;
    }
    (*this->_vptr_VCToolBase[2])(this,pcVar2);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_48);
    pPVar1 = (options->super_QList<ProString>).d.ptr;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void parseOptions(const ProStringList& options) {
        for (ProStringList::ConstIterator it=options.begin(); (it!=options.end()); it++)
            parseOption((*it).toLatin1().constData());
    }